

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall wasm::TypeUpdater::visitExpression(TypeUpdater *this,Expression *curr)

{
  Expression *pEVar1;
  bool bVar2;
  size_t sVar3;
  Expression **ppEVar4;
  mapped_type *ppEVar5;
  Block *pBVar6;
  mapped_type *pmVar7;
  Block *block;
  Expression *curr_local;
  TypeUpdater *this_local;
  
  block = (Block *)curr;
  curr_local = (Expression *)this;
  sVar3 = SmallVector<wasm::Expression_*,_10UL>::size
                    (&(this->
                      super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                      ).expressionStack);
  if (sVar3 < 2) {
    ppEVar5 = std::
              map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
              ::operator[](&this->parents,(key_type *)&block);
    *ppEVar5 = (mapped_type)0x0;
  }
  else {
    sVar3 = SmallVector<wasm::Expression_*,_10UL>::size
                      (&(this->
                        super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                        ).expressionStack);
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                        (&(this->
                          super_ExpressionStackWalker<wasm::TypeUpdater,_wasm::UnifiedExpressionVisitor<wasm::TypeUpdater,_void>_>
                          ).expressionStack,sVar3 - 2);
    pEVar1 = *ppEVar4;
    ppEVar5 = std::
              map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
              ::operator[](&this->parents,(key_type *)&block);
    *ppEVar5 = pEVar1;
  }
  pBVar6 = Expression::dynCast<wasm::Block>((Expression *)block);
  if (pBVar6 == (Block *)0x0) {
    BranchUtils::
    operateOnScopeNameUses<wasm::TypeUpdater::visitExpression(wasm::Expression*)::_lambda(wasm::Name&)_1_>
              ((Expression *)block,(anon_class_8_1_8991fb9c)this);
  }
  else {
    bVar2 = IString::is(&(pBVar6->name).super_IString);
    if (bVar2) {
      pmVar7 = std::
               map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
               ::operator[](&this->blockInfos,&pBVar6->name);
      pmVar7->block = pBVar6;
    }
  }
  discoverBreaks(this,(Expression *)block,1);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    if (expressionStack.size() > 1) {
      parents[curr] = expressionStack[expressionStack.size() - 2];
    } else {
      parents[curr] = nullptr; // this is the top level
    }
    // discover block/break relationships
    if (auto* block = curr->dynCast<Block>()) {
      if (block->name.is()) {
        blockInfos[block->name].block = block;
      }
    } else {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        // ensure info exists, discoverBreaks can then fill it
        blockInfos[name];
      });
    }
    // add a break to the info, for break and switch
    discoverBreaks(curr, +1);
  }